

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_augment(lys_module *module,lys_node_augment *augment,int options,unres_schema *unres)

{
  lys_node *nodes;
  lys_when *parent;
  int iVar1;
  
  nodes = augment->child;
  augment->child = (lys_node *)0x0;
  iVar1 = yang_check_iffeatures(module,(void *)0x0,augment,AUGMENT_KEYWORD,unres);
  if (iVar1 == 0) {
    iVar1 = yang_check_nodes(module,(lys_node *)augment,nodes,options,unres);
    if (((iVar1 == 0) &&
        (iVar1 = yang_check_ext_instance(module,&augment->ext,(uint)augment->ext_size,augment,unres)
        , iVar1 == 0)) &&
       ((parent = augment->when, parent == (lys_when *)0x0 ||
        (iVar1 = yang_check_ext_instance(module,&parent->ext,(uint)parent->ext_size,parent,unres),
        iVar1 == 0)))) {
      if (((module->ctx->models).flags & 2) != 0) {
        return 0;
      }
      if (augment->when == (lys_when *)0x0) {
        return 0;
      }
      if ((options & 4U) == 0) {
        iVar1 = unres_schema_add_node(module,unres,augment,UNRES_XPATH,(lys_node *)0x0);
        if (iVar1 != -1) {
          return 0;
        }
      }
      else {
        iVar1 = lyxp_node_check_syntax((lys_node *)augment);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  }
  else {
    yang_free_nodes(module->ctx,nodes);
  }
  return 1;
}

Assistant:

static int
yang_check_augment(struct lys_module *module, struct lys_node_augment *augment, int options, struct unres_schema *unres)
{
    struct lys_node *child;

    child = augment->child;
    augment->child = NULL;

    if (yang_check_iffeatures(module, NULL, augment, AUGMENT_KEYWORD, unres)) {
        yang_free_nodes(module->ctx, child);
        goto error;
    }

    if (yang_check_nodes(module, (struct lys_node *)augment, child, options, unres)) {
        goto error;
    }

    if (yang_check_ext_instance(module, &augment->ext, augment->ext_size, augment, unres)) {
        goto error;
    }

    if (augment->when && yang_check_ext_instance(module, &augment->when->ext, augment->when->ext_size, augment->when, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && augment->when) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)augment)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, augment, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}